

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::MixedContentModel::validateContentSpecial
          (MixedContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          GrammarResolver *pGrammarResolver,XMLStringPool *pStringPool,XMLSize_t *indexFailingChild,
          MemoryManager *param_7)

{
  NodeTypes NVar1;
  QName *pQVar2;
  QName *pQVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uriId_1;
  QName *inChild_1;
  NodeTypes type_1;
  uint inIndex_1;
  QName *curChild_1;
  uint outIndex_1;
  uint uriId;
  QName *inChild;
  NodeTypes type;
  QName *curChild;
  uint outIndex;
  uint inIndex;
  SubstitutionGroupComparator comparator;
  XMLStringPool *pStringPool_local;
  GrammarResolver *pGrammarResolver_local;
  uint param_3_local;
  XMLSize_t childCount_local;
  QName **children_local;
  MixedContentModel *this_local;
  
  comparator.fStringPool = pStringPool;
  SubstitutionGroupComparator::SubstitutionGroupComparator
            ((SubstitutionGroupComparator *)&outIndex,pGrammarResolver,pStringPool);
  if ((this->fOrdered & 1U) == 0) {
    for (curChild_1._4_4_ = 0; curChild_1._4_4_ < childCount;
        curChild_1._4_4_ = curChild_1._4_4_ + 1) {
      pQVar2 = children[curChild_1._4_4_];
      uVar5 = QName::getURI(pQVar2);
      if (uVar5 != 0xffffffff) {
        for (inChild_1._4_4_ = 0; (ulong)inChild_1._4_4_ < this->fCount;
            inChild_1._4_4_ = inChild_1._4_4_ + 1) {
          NVar1 = this->fChildTypes[inChild_1._4_4_];
          pQVar3 = this->fChildren[inChild_1._4_4_];
          if (NVar1 == Leaf) {
            bVar4 = SubstitutionGroupComparator::isEquivalentTo
                              ((SubstitutionGroupComparator *)&outIndex,pQVar2,pQVar3);
            if (bVar4) break;
          }
          else {
            if (NVar1 == Any) break;
            if (NVar1 == Any_NS) {
              uVar5 = QName::getURI(pQVar3);
              uVar6 = QName::getURI(pQVar2);
              if (uVar5 == uVar6) break;
            }
            else if (((NVar1 == Any_Other) && (uVar5 = QName::getURI(pQVar2), uVar5 != 1)) &&
                    (uVar6 = QName::getURI(pQVar3), uVar5 != uVar6)) break;
          }
        }
        if ((ulong)inChild_1._4_4_ == this->fCount) {
          *indexFailingChild = (ulong)curChild_1._4_4_;
          this_local._7_1_ = false;
          goto LAB_003d0b91;
        }
      }
    }
  }
  else {
    curChild._4_4_ = 0;
    for (curChild._0_4_ = 0; (uint)curChild < childCount; curChild._0_4_ = (uint)curChild + 1) {
      pQVar2 = children[(uint)curChild];
      uVar5 = QName::getURI(pQVar2);
      if (uVar5 != 0xffffffff) {
        NVar1 = this->fChildTypes[curChild._4_4_];
        pQVar3 = this->fChildren[curChild._4_4_];
        if (NVar1 == Leaf) {
          bVar4 = SubstitutionGroupComparator::isEquivalentTo
                            ((SubstitutionGroupComparator *)&outIndex,pQVar2,pQVar3);
          if (!bVar4) {
            *indexFailingChild = (ulong)(uint)curChild;
            this_local._7_1_ = false;
            goto LAB_003d0b91;
          }
        }
        else if (NVar1 != Any) {
          if (NVar1 == Any_NS) {
            uVar5 = QName::getURI(pQVar3);
            uVar6 = QName::getURI(pQVar2);
            if (uVar5 != uVar6) {
              *indexFailingChild = (ulong)(uint)curChild;
              this_local._7_1_ = false;
              goto LAB_003d0b91;
            }
          }
          else if ((NVar1 == Any_Other) &&
                  ((uVar5 = QName::getURI(pQVar2), uVar5 == 1 ||
                   (uVar6 = QName::getURI(pQVar3), uVar5 == uVar6)))) {
            *indexFailingChild = (ulong)(uint)curChild;
            this_local._7_1_ = false;
            goto LAB_003d0b91;
          }
        }
        curChild._4_4_ = curChild._4_4_ + 1;
      }
    }
  }
  this_local._7_1_ = true;
LAB_003d0b91:
  SubstitutionGroupComparator::~SubstitutionGroupComparator
            ((SubstitutionGroupComparator *)&outIndex);
  return this_local._7_1_;
}

Assistant:

bool MixedContentModel::validateContentSpecial(QName** const          children
                                            , XMLSize_t               childCount
                                            , unsigned int
                                            , GrammarResolver*  const pGrammarResolver
                                            , XMLStringPool*    const pStringPool
                                            , XMLSize_t*              indexFailingChild
                                            , MemoryManager*    const) const
{

    SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

    // must match order
    if (fOrdered) {
        unsigned int inIndex = 0;
        for (unsigned int outIndex = 0; outIndex < childCount; outIndex++) {

            // Get the current child out of the source index
            QName* curChild = children[outIndex];

            // If its PCDATA, then we just accept that
            if (curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            ContentSpecNode::NodeTypes type = fChildTypes[inIndex];
            QName* inChild = fChildren[inIndex];

            if (type == ContentSpecNode::Leaf) {
                if ( !comparator.isEquivalentTo(curChild, inChild))
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }
            else if (type == ContentSpecNode::Any) {
            }
            else if (type == ContentSpecNode::Any_NS) {
                if (inChild->getURI() != curChild->getURI())
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }
            else if (type == ContentSpecNode::Any_Other)
            {
                // Here we assume that empty string has id 1.
                //
                unsigned int uriId = curChild->getURI();
                if (uriId == 1 || uriId == inChild->getURI())
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }

            // advance index
            inIndex++;
        }
    }

    // can appear in any order
    else {
        for (unsigned int outIndex = 0; outIndex < childCount; outIndex++) {
            // Get the current child out of the source index
            QName* curChild = children[outIndex];

            // If its PCDATA, then we just accept that
            if (curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            // And try to find it in our list
            unsigned int inIndex = 0;
            for (; inIndex < fCount; inIndex++)
            {
                ContentSpecNode::NodeTypes type = fChildTypes[inIndex];
                QName* inChild = fChildren[inIndex];

                if (type == ContentSpecNode::Leaf) {
                    if ( comparator.isEquivalentTo(curChild, inChild))
                        break;
                }
                else if (type == ContentSpecNode::Any) {
                    break;
                }
                else if (type == ContentSpecNode::Any_NS) {
                    if (inChild->getURI() == curChild->getURI())
                        break;
                }
                else if (type == ContentSpecNode::Any_Other)
                {
                  // Here we assume that empty string has id 1.
                  //
                  unsigned int uriId = curChild->getURI();
                  if (uriId != 1 && uriId != inChild->getURI())
                    break;
                }

                // REVISIT: What about checking for multiple ANY matches?
                //          The content model ambiguity *could* be checked
                //          by the caller before constructing the mixed
                //          content model.
            }
            // We did not find this one, so the validation failed
            if (inIndex == fCount)
            {
                *indexFailingChild=outIndex;
                return false;
            }
        }
    }

    // Everything seems to be in order, so return success
    return true;
}